

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *p,Vec_Int_t *vTrace,Vec_Int_t *vMemObjs,Vec_Wrd_t *vValues)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  word *pwVar6;
  uint uVar7;
  int iVar8;
  ushort uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  
  iVar8 = vTrace->nSize;
  if ((long)iVar8 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  uVar11 = vTrace->pArray[(long)iVar8 + -1];
  uVar7 = (int)uVar11 >> 0xb;
  if ((-1 < (int)uVar7) && (iVar10 = (p->vCopies).nSize, (int)uVar7 < iVar10)) {
    uVar1 = *vTrace->pArray;
    uVar12 = (int)uVar1 >> 0xb;
    if ((-1 < (int)uVar12) && ((int)uVar12 < iVar10)) {
      if (iVar8 == 1) {
        __assert_fail("Vec_IntSize(vTrace) >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                      ,0x346,
                      "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                     );
      }
      piVar5 = (p->vCopies).pArray;
      uVar2 = piVar5[uVar7];
      if ((-1 < (int)uVar2) && (iVar8 = vMemObjs->nSize, (int)uVar2 < iVar8)) {
        if (uVar7 != vMemObjs->pArray[uVar2]) {
          __assert_fail("iObjLast == Vec_IntEntry(vMemObjs, iNumLast)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                        ,0x347,
                        "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                       );
        }
        uVar3 = piVar5[uVar12];
        if ((-1 < (int)uVar3) && ((int)uVar3 < iVar8)) {
          if (uVar12 != vMemObjs->pArray[uVar3]) {
            __assert_fail("iObjFirst == Vec_IntEntry(vMemObjs, iNumFirst)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                          ,0x348,
                          "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                         );
          }
          if ((((uVar11 < 0x800) || (p->nObjsAlloc <= (int)uVar7)) || ((int)uVar12 < 1)) ||
             (p->nObjsAlloc <= (int)uVar12)) {
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                          ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
          if ((undefined1  [24])((undefined1  [24])p->pObjs[uVar7] & (undefined1  [24])0x3f) !=
              (undefined1  [24])0x36) {
            __assert_fail("Wlc_ObjType(pObjLast) == WLC_OBJ_READ",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                          ,0x34b,
                          "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                         );
          }
          uVar9 = *(ushort *)(p->pObjs + uVar12) & 0x3f;
          if (uVar9 == 1) {
            return 0;
          }
          if (uVar9 != 0x37) {
            __assert_fail("Wlc_ObjType(pObjFirst) == WLC_OBJ_WRITE || Wlc_ObjIsPi(pObjFirst)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                          ,0x34c,
                          "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                         );
          }
          iVar10 = (uVar11 >> 1 & 0x3ff) * iVar8 + uVar2;
          if (-1 < iVar10) {
            iVar10 = iVar10 * 3;
            uVar11 = iVar10 + 1;
            iVar4 = vValues->nSize;
            if (((int)uVar11 < iVar4) && (iVar8 = (uVar1 >> 1 & 0x3ff) * iVar8 + uVar3, -1 < iVar8))
            {
              uVar7 = iVar8 * 3 + 1;
              if ((int)uVar7 < iVar4) {
                pwVar6 = vValues->pArray;
                if (pwVar6[uVar11] != pwVar6[uVar7]) {
                  __assert_fail("Vec_WrdEntry(vValues, iIndLast + 1) == Vec_WrdEntry(vValues, iIndFirst + 1)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                                ,0x34f,
                                "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                               );
                }
                uVar11 = iVar10 + 2;
                if ((((int)uVar11 < iVar4) && (-1 < iVar8)) &&
                   (uVar7 = iVar8 * 3 + 2, (int)uVar7 < iVar4)) {
                  return (uint)(pwVar6[uVar11] != pwVar6[uVar7]);
                }
              }
            }
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Wlc_NtkTraceCheckConfict( Wlc_Ntk_t * p, Vec_Int_t * vTrace, Vec_Int_t * vMemObjs, Vec_Wrd_t * vValues )
{
    Wlc_Obj_t * pObjLast, * pObjFirst; 
    int iObjLast = Vec_IntEntryLast(vTrace) >> 11;
    int iFrmLast =(Vec_IntEntryLast(vTrace) >> 1) & 0x3FF;
    int iNumLast = Wlc_ObjCopy( p, iObjLast );
    int iIndLast = 3*(iFrmLast*Vec_IntSize(vMemObjs) + iNumLast);
    int iObjFirst = Vec_IntEntry(vTrace, 0) >> 11;
    int iFrmFirst =(Vec_IntEntry(vTrace, 0) >> 1) & 0x3FF;
    int iNumFirst = Wlc_ObjCopy( p, iObjFirst );
    int iIndFirst = 3*(iFrmFirst*Vec_IntSize(vMemObjs) + iNumFirst);
    assert( Vec_IntSize(vTrace) >= 2 );
    assert( iObjLast  == Vec_IntEntry(vMemObjs, iNumLast) );
    assert( iObjFirst == Vec_IntEntry(vMemObjs, iNumFirst) );
    pObjLast  = Wlc_NtkObj(p, iObjLast);
    pObjFirst = Wlc_NtkObj(p, iObjFirst);
    assert( Wlc_ObjType(pObjLast) == WLC_OBJ_READ );
    assert( Wlc_ObjType(pObjFirst) == WLC_OBJ_WRITE || Wlc_ObjIsPi(pObjFirst) );
    if ( Wlc_ObjIsPi(pObjFirst) )
        return 0;
    assert( Vec_WrdEntry(vValues, iIndLast + 1) == Vec_WrdEntry(vValues, iIndFirst + 1) ); // equal addr
    return Vec_WrdEntry(vValues, iIndLast + 2) != Vec_WrdEntry(vValues, iIndFirst + 2); // diff data
}